

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_4b1109::cmMacroHelperCommand::operator()
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  pointer *this_00;
  pointer this_01;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  iterator end;
  ulong uVar5;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *pvVar6;
  reference pvVar7;
  reference pvVar8;
  string *psVar9;
  long lVar10;
  long lineEnd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  bool local_531;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  undefined1 local_408 [8];
  cmExecutionStatus status;
  string local_3a8;
  undefined1 local_388 [8];
  cmListFileFunction newLFF;
  uint t;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  uint local_2fc;
  undefined1 local_2f8 [4];
  uint j_2;
  cmListFileArgument arg;
  cmListFileArgument *k;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range2;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  cmListFileFunction *func;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  char local_268 [4];
  uint j_1;
  char argvName [60];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  uint local_1cc;
  undefined1 local_1c8 [4];
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  string_view local_1a0;
  undefined1 local_190 [8];
  string expandedArgv;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_150;
  undefined1 local_140 [8];
  string expandedArgn;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  eit;
  string argcDef;
  MacroPushPop macroScope;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string errorMsg;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmMakefile *makefile;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmMacroHelperCommand *this_local;
  
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmExecutionStatus::GetMakefile(inStatus);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  cmMakefile::ExpandArguments
            ((cmMakefile *)
             expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Args);
  if (sVar2 < sVar3 - 1) {
    cmAlphaNum::cmAlphaNum(&local_a8,"Macro invoked with incorrect arguments for macro named: ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->Args,0);
    cmAlphaNum::cmAlphaNum(&local_d8,pvVar4);
    cmStrCat<>((string *)local_78,&local_a8,&local_d8);
    cmExecutionStatus::SetError(inStatus,(string *)local_78);
    this_local._7_1_ = 0;
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              ((MacroPushPop *)((long)&argcDef.field_2 + 8),
               (cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->FilePath,&this->Policies);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
    std::__cxx11::to_string((string *)&eit,sVar2);
    expandedArgn.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Args);
    begin = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&expandedArgn.field_2 + 8),sVar2 - 1);
    end = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
    local_150 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (begin,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )end._M_current);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&expandedArgv.field_2 + 8)
               ,";");
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_140,&local_150,stack0xfffffffffffffe90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0,";");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmJoin((string *)local_190,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,local_1a0,stack0xfffffffffffffe50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Args);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8,sVar2 - 1);
    local_1cc = 1;
    while( true ) {
      uVar5 = (ulong)local_1cc;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Args);
      if (sVar2 <= uVar5) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->Args,(ulong)local_1cc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &argVs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"${",pvVar4);
      std::operator+(&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &argVs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"}");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string
                ((string *)
                 &argVs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1cc = local_1cc + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(argvName + 0x38));
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(argvName + 0x38),sVar2);
    __range1._4_4_ = 0;
    while( true ) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
      if (sVar2 <= __range1._4_4_) break;
      snprintf(local_268,0x3c,"${ARGV%u}",(ulong)__range1._4_4_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char(&)[60]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (argvName + 0x38),(char (*) [60])local_268);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       (&this->Functions);
    func = (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                     (&this->Functions);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                  *)&func);
      if (!bVar1) break;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                    ::operator*(&__end1);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&__range2);
      pvVar6 = cmListFileFunction::Arguments
                         ((cmListFileFunction *)
                          newLFFArgs.
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar2 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(pvVar6);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&__range2,sVar2)
      ;
      pvVar6 = cmListFileFunction::Arguments
                         ((cmListFileFunction *)
                          newLFFArgs.
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(pvVar6);
      k = (cmListFileArgument *)
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(pvVar6);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                    *)&k);
        if (!bVar1) break;
        arg.Line = (long)__gnu_cxx::
                         __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                         ::operator*(&__end2);
        cmListFileArgument::cmListFileArgument((cmListFileArgument *)local_2f8);
        std::__cxx11::string::operator=((string *)local_2f8,(string *)arg.Line);
        if (*(int *)(arg.Line + 0x20) != 2) {
          local_2fc = 0;
          while( true ) {
            uVar5 = (ulong)local_2fc;
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8);
            if (sVar2 <= uVar5) break;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1c8,(ulong)local_2fc);
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_48,(ulong)local_2fc);
            cmsys::SystemTools::ReplaceString((string *)local_2f8,pvVar7,pvVar8);
            local_2fc = local_2fc + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"${ARGC}",&local_321);
          cmsys::SystemTools::ReplaceString((string *)local_2f8,&local_320,(string *)&eit);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"${ARGN}",&local_349);
          cmsys::SystemTools::ReplaceString((string *)local_2f8,&local_348,(string *)local_140);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator(&local_349);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&t,"${ARGV}",
                     (allocator<char> *)
                     ((long)&newLFF.Impl.
                             super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          cmsys::SystemTools::ReplaceString((string *)local_2f8,(string *)&t,(string *)local_190);
          std::__cxx11::string::~string((string *)&t);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&newLFF.Impl.
                             super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          lVar10 = std::__cxx11::string::find(local_2f8,0xbd8be7);
          if (lVar10 != -1) {
            newLFF.Impl.
            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._0_4_ = 0;
            while( true ) {
              uVar5 = (ulong)(uint)newLFF.Impl.
                                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
              sVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_48);
              if (sVar2 <= uVar5) break;
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)(argvName + 0x38),
                                    (ulong)(uint)newLFF.Impl.
                                                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_48,
                                    (ulong)(uint)newLFF.Impl.
                                                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
              cmsys::SystemTools::ReplaceString((string *)local_2f8,pvVar7,pvVar8);
              newLFF.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._0_4_ =
                   (uint)newLFF.Impl.
                         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 1;
            }
          }
        }
        arg.Value.field_2._8_4_ = *(undefined4 *)(arg.Line + 0x20);
        arg._32_8_ = *(undefined8 *)(arg.Line + 0x28);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&__range2,
                   (value_type *)local_2f8);
        cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_2f8);
        __gnu_cxx::
        __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
        ::operator++(&__end2);
      }
      psVar9 = cmListFileFunction::OriginalName_abi_cxx11_
                         ((cmListFileFunction *)
                          newLFFArgs.
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::string((string *)&local_3a8,(string *)psVar9);
      lVar10 = cmListFileFunction::Line
                         ((cmListFileFunction *)
                          newLFFArgs.
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lineEnd = cmListFileFunction::LineEnd
                          ((cmListFileFunction *)
                           newLFFArgs.
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = &status.Variables.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_00,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&__range2);
      cmListFileFunction::cmListFileFunction
                ((cmListFileFunction *)local_388,&local_3a8,lVar10,lineEnd,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_00);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                 &status.Variables.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_3a8);
      cmExecutionStatus::cmExecutionStatus
                ((cmExecutionStatus *)local_408,
                 (cmMakefile *)
                 expandedArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_01 = expandedArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_430);
      bVar1 = cmMakefile::ExecuteCommand
                        ((cmMakefile *)this_01,(cmListFileFunction *)local_388,
                         (cmExecutionStatus *)local_408,&local_430);
      local_531 = true;
      if (bVar1) {
        local_531 = cmExecutionStatus::GetNestedError((cmExecutionStatus *)local_408);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_430);
      if (local_531 == false) {
        bVar1 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_408);
        if (bVar1) {
          __x = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_408);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_448,__x);
          cmExecutionStatus::SetReturnInvoked(inStatus,&local_448);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_448);
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          bVar1 = cmExecutionStatus::GetBreakInvoked((cmExecutionStatus *)local_408);
          if (bVar1) {
            cmExecutionStatus::SetBreakInvoked(inStatus);
            this_local._7_1_ = 1;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
      }
      else {
        cmMakefile::MacroPushPop::Quiet((MacroPushPop *)((long)&argcDef.field_2 + 8));
        cmExecutionStatus::SetNestedError(inStatus);
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_408);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_388);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&__range2);
      if (bVar1) goto LAB_00333c43;
      __gnu_cxx::
      __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 1;
LAB_00333c43:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(argvName + 0x38));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)&eit);
    cmMakefile::MacroPushPop::~MacroPushPop((MacroPushPop *)((long)&argcDef.field_2 + 8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMacroHelperCommand::operator()(
  std::vector<cmListFileArgument> const& args,
  cmExecutionStatus& inStatus) const
{
  cmMakefile& makefile = inStatus.GetMakefile();

  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  makefile.ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      cmStrCat("Macro invoked with incorrect arguments for macro named: ",
               this->Args[0]);
    inStatus.SetError(errorMsg);
    return false;
  }

  cmMakefile::MacroPushPop macroScope(&makefile, this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::string argcDef = std::to_string(expandedArgs.size());

  auto eit = expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    variables.push_back("${" + this->Args[j] + "}");
  }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j) {
    snprintf(argvName, sizeof(argvName), "${ARGV%u}", j);
    argVs.emplace_back(argvName);
  }
  // Invoke all the functions that were collected in the block.
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    // Replace the formal arguments and then invoke the command.
    std::vector<cmListFileArgument> newLFFArgs;
    newLFFArgs.reserve(func.Arguments().size());

    // for each argument of the current function
    for (cmListFileArgument const& k : func.Arguments()) {
      cmListFileArgument arg;
      arg.Value = k.Value;
      if (k.Delim != cmListFileArgument::Bracket) {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j) {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
        }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos) {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
            cmSystemTools::ReplaceString(arg.Value, argVs[t], expandedArgs[t]);
          }
        }
      }
      arg.Delim = k.Delim;
      arg.Line = k.Line;
      newLFFArgs.push_back(std::move(arg));
    }
    cmListFileFunction newLFF{ func.OriginalName(), func.Line(),
                               func.LineEnd(), std::move(newLFFArgs) };
    cmExecutionStatus status(makefile);
    if (!makefile.ExecuteCommand(newLFF, status) || status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
  }
  return true;
}